

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# largebuddyrange.h
# Opt level: O1

void snmalloc::
     BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>
     ::set_red(Contents k,bool new_is_red)

{
  Contents *pCVar1;
  ulong uVar2;
  
  if (k == 0) {
    pCVar1 = &ref::null_entry;
  }
  else {
    uVar2 = k >> 10 & 0xfffffffffffffff0;
    pCVar1 = (Contents *)
             ((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                       ::concretePagemap.body)->
                     super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                     ).super_MetaEntryBase.meta + uVar2);
    if ((*(byte *)((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                            ::concretePagemap.body)->
                          super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                          ).super_MetaEntryBase.remote_and_sizeclass + uVar2) & 0x80) == 0) {
      *pCVar1 = *pCVar1 & 1;
      pCVar1[1] = 0x80;
    }
  }
  if ((bool)(*(byte *)((long)pCVar1 + 1) & 1) != new_is_red) {
    if (k == 0) {
      pCVar1 = &ref::null_entry;
    }
    else {
      uVar2 = k >> 10 & 0xfffffffffffffff0;
      pCVar1 = (Contents *)
               ((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                         ::concretePagemap.body)->
                       super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                       ).super_MetaEntryBase.meta + uVar2);
      if ((*(byte *)((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                              ::concretePagemap.body)->
                            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                            ).super_MetaEntryBase.remote_and_sizeclass + uVar2) & 0x80) == 0) {
        *pCVar1 = *pCVar1 & 1;
        pCVar1[1] = 0x80;
      }
    }
    *(byte *)((long)pCVar1 + 1) = *(byte *)((long)pCVar1 + 1) ^ 1;
  }
  return;
}

Assistant:

static Handle ref(bool direction, Contents k)
    {
      // Special case for accessing the null entry.  We want to make sure
      // that this is never modified by the back end, so we make it point to
      // a constant entry and use the MMU to trap even in release modes.
      static const Contents null_entry = 0;
      if (SNMALLOC_UNLIKELY(address_cast(k) == 0))
      {
        return {const_cast<Contents*>(&null_entry)};
      }
      auto& entry = Pagemap::template get_metaentry_mut<false>(address_cast(k));
      if (direction)
        return entry.get_backend_word(Pagemap::Entry::Word::One);

      return entry.get_backend_word(Pagemap::Entry::Word::Two);
    }